

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O3

void pce_pal(int *ip)

{
  uint offset;
  int iVar1;
  char *stptr;
  
  labldef(loccnt,1);
  if (lastlabl == (t_symbol *)0x0) {
    stptr = "No label!";
LAB_00110f2f:
    error(stptr);
    return;
  }
  iVar1 = evaluate(ip,';');
  offset = value;
  if (iVar1 != 0) {
    if (0xf < value) {
      stptr = "Incorrect palette index!";
      goto LAB_00110f2f;
    }
    lastlabl->pal = value;
    if (pass == 1) {
      loadlc(offset,1);
      println();
      return;
    }
  }
  return;
}

Assistant:

void
pce_pal(int *ip)
{
	/* define label */
	labldef(loccnt, 1);

	/* check if there's a label */
	if (lastlabl == NULL) {
		error("No label!");
		return;
	}

	/* get the palette index */
	if (!evaluate(ip, ';'))
		return;
	if (value > 15) {
		error("Incorrect palette index!");
		return;
	}
	lastlabl->pal = value;

	/* output line */
	if (pass == LAST_PASS) {
		loadlc(value, 1);
		println();
	}
}